

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::EscapeForShell
          (string *__return_storage_ptr__,cmOutputConverter *this,string *str,bool makeVars,
          bool forEcho,bool useWatcomQuote)

{
  bool bVar1;
  cmState *pcVar2;
  cmOutputConverter *this_00;
  uint flags_00;
  undefined7 in_register_00000081;
  uint local_28;
  int flags;
  bool useWatcomQuote_local;
  bool forEcho_local;
  bool makeVars_local;
  string *str_local;
  cmOutputConverter *this_local;
  
  flags_00 = (uint)CONCAT71(in_register_00000081,forEcho) & 0xffffff01;
  bVar1 = cmOutputConverterIsShellOperator(str);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  else {
    pcVar2 = GetState(this);
    bVar1 = cmState::UseWindowsVSIDE(pcVar2);
    if (bVar1) {
      local_28 = 2;
    }
    else {
      local_28 = (uint)((this->LinkScriptShell & 1U) == 0);
    }
    if (makeVars) {
      local_28 = local_28 | 0x40;
    }
    if (forEcho) {
      local_28 = local_28 | 4;
    }
    if (useWatcomQuote) {
      local_28 = local_28 | 0x80;
    }
    pcVar2 = GetState(this);
    bVar1 = cmState::UseWatcomWMake(pcVar2);
    if (bVar1) {
      local_28 = local_28 | 8;
    }
    pcVar2 = GetState(this);
    bVar1 = cmState::UseMinGWMake(pcVar2);
    if (bVar1) {
      local_28 = local_28 | 0x10;
    }
    pcVar2 = GetState(this);
    bVar1 = cmState::UseNMake(pcVar2);
    if (bVar1) {
      local_28 = local_28 | 0x20;
    }
    pcVar2 = GetState(this);
    bVar1 = cmState::UseWindowsShell(pcVar2);
    if (!bVar1) {
      local_28 = local_28 | 0x100;
    }
    this_00 = (cmOutputConverter *)std::__cxx11::string::c_str();
    Shell__GetArgument_abi_cxx11_(__return_storage_ptr__,this_00,(char *)(ulong)local_28,flags_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForShell(const std::string& str,
                                              bool makeVars, bool forEcho,
                                              bool useWatcomQuote) const
{
  // Do not escape shell operators.
  if (cmOutputConverterIsShellOperator(str)) {
    return str;
  }

  // Compute the flags for the target shell environment.
  int flags = 0;
  if (this->GetState()->UseWindowsVSIDE()) {
    flags |= Shell_Flag_VSIDE;
  } else if (!this->LinkScriptShell) {
    flags |= Shell_Flag_Make;
  }
  if (makeVars) {
    flags |= Shell_Flag_AllowMakeVariables;
  }
  if (forEcho) {
    flags |= Shell_Flag_EchoWindows;
  }
  if (useWatcomQuote) {
    flags |= Shell_Flag_WatcomQuote;
  }
  if (this->GetState()->UseWatcomWMake()) {
    flags |= Shell_Flag_WatcomWMake;
  }
  if (this->GetState()->UseMinGWMake()) {
    flags |= Shell_Flag_MinGWMake;
  }
  if (this->GetState()->UseNMake()) {
    flags |= Shell_Flag_NMake;
  }
  if (!this->GetState()->UseWindowsShell()) {
    flags |= Shell_Flag_IsUnix;
  }

  return Shell__GetArgument(str.c_str(), flags);
}